

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_parse.cpp
# Opt level: O0

void argparse(Option_group *group)

{
  Option *this;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Option_group *local_10;
  Option_group *group_local;
  
  local_10 = group;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"--dv",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  this = CLI::App::add_option<Values<double>,_Values<double>,_(CLI::detail::enabler)0>
                   (&group->super_App,&local_30,&doubles,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"0",&local_91);
  CLI::Option::default_str(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void argparse(CLI::Option_group *group) { group->add_option("--dv", doubles)->default_str("0"); }